

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

bool __thiscall brynet::TimerMgr::CompareTimer::operator()(CompareTimer *this,Ptr *left,Ptr *right)

{
  element_type *peVar1;
  time_point *__lhs;
  time_point *__rhs;
  nanoseconds *__lhs_00;
  nanoseconds *__rhs_00;
  rep rVar2;
  rep rVar3;
  rep diff;
  type lastDiff;
  type startDiff;
  Ptr *right_local;
  Ptr *left_local;
  CompareTimer *this_local;
  
  peVar1 = std::__shared_ptr_access<brynet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<brynet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)left);
  __lhs = Timer::getStartTime(peVar1);
  peVar1 = std::__shared_ptr_access<brynet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<brynet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)right);
  __rhs = Timer::getStartTime(peVar1);
  lastDiff = std::chrono::operator-(__lhs,__rhs);
  peVar1 = std::__shared_ptr_access<brynet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<brynet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)left);
  __lhs_00 = Timer::getLastTime(peVar1);
  peVar1 = std::__shared_ptr_access<brynet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<brynet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)right);
  __rhs_00 = Timer::getLastTime(peVar1);
  diff = (rep)std::chrono::operator-(__lhs_00,__rhs_00);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&lastDiff);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&diff);
  return 0 < rVar2 + rVar3;
}

Assistant:

bool operator() (const Timer::Ptr& left, const Timer::Ptr& right) const
            {
                auto startDiff = left->getStartTime() - right->getStartTime();
                auto lastDiff = left->getLastTime() - right->getLastTime();
                auto diff = startDiff.count() + lastDiff.count();
                return diff > 0;
            }